

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_string.cc
# Opt level: O0

TemplateString *
ctemplate::TemplateString::IdToString(TemplateString *__return_storage_ptr__,TemplateId id)

{
  TemplateString v;
  undefined7 uVar1;
  value_type *pvVar2;
  TemplateString *iter;
  TemplateString id_as_template_string;
  ReaderMutexLock local_18;
  ReaderMutexLock reader_lock;
  TemplateId id_local;
  
  reader_lock.mu_ = (Mutex *)id;
  ReaderMutexLock::ReaderMutexLock(&local_18,(Mutex *)&(anonymous_namespace)::mutex);
  if ((anonymous_namespace)::template_string_set ==
      (unordered_set<ctemplate::TemplateString,_ctemplate::TemplateStringHasher,_std::equal_to<ctemplate::TemplateString>,_std::allocator<ctemplate::TemplateString>_>
       *)0x0) {
    TemplateString(__return_storage_ptr__,(StaticTemplateString *)kStsEmpty);
  }
  else {
    TemplateString((TemplateString *)&iter,(char *)0x0,0,false,(TemplateId)reader_lock.mu_);
    v.length_ = (size_t)id_as_template_string.ptr_;
    v.ptr_ = (char *)iter;
    v._16_8_ = id_as_template_string.length_;
    v.id_ = id_as_template_string._16_8_;
    pvVar2 = find_ptr0<std::unordered_set<ctemplate::TemplateString,ctemplate::TemplateStringHasher,std::equal_to<ctemplate::TemplateString>,std::allocator<ctemplate::TemplateString>>,ctemplate::TemplateString>
                       ((anonymous_namespace)::template_string_set,v);
    if (pvVar2 == (value_type *)0x0) {
      TemplateString(__return_storage_ptr__,(StaticTemplateString *)kStsEmpty);
    }
    else {
      __return_storage_ptr__->ptr_ = pvVar2->ptr_;
      __return_storage_ptr__->length_ = pvVar2->length_;
      uVar1 = *(undefined7 *)&pvVar2->field_0x11;
      __return_storage_ptr__->is_immutable_ = pvVar2->is_immutable_;
      *(undefined7 *)&__return_storage_ptr__->field_0x11 = uVar1;
      __return_storage_ptr__->id_ = pvVar2->id_;
    }
  }
  id_as_template_string.id_._0_4_ = 1;
  ReaderMutexLock::~ReaderMutexLock(&local_18);
  return __return_storage_ptr__;
}

Assistant:

LOCKS_EXCLUDED(mutex) {
  ReaderMutexLock reader_lock(&mutex);
  if (!template_string_set)
    return TemplateString(kStsEmpty);
  // To search the set by TemplateId, we must first construct a dummy
  // TemplateString.  This may seem weird, but it lets us use a
  // hash_set instead of a hash_map.
  TemplateString id_as_template_string(NULL, 0, false, id);
  const TemplateString* iter = find_ptr0(*template_string_set, id_as_template_string);
  return iter ? *iter : TemplateString(kStsEmpty);
}